

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

Node * GetNodeByAnchor(TidyDocImpl *doc,ctmbstr name)

{
  char cVar1;
  int iVar2;
  tmbstr s;
  uint uVar3;
  char *pcVar4;
  Anchor *pAVar5;
  
  s = prvTidytmbstrdup(doc->allocator,name);
  iVar2 = prvTidyHTMLVersion(doc);
  if (iVar2 == 0x20000) {
    uVar3 = 0;
    if ((name != (ctmbstr)0x0) && (cVar1 = *name, uVar3 = 0, cVar1 != '\0')) {
      pcVar4 = name + 1;
      uVar3 = 0;
      do {
        uVar3 = uVar3 * 0x1f + (int)cVar1;
        cVar1 = *pcVar4;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\0');
      uVar3 = uVar3 % 0x3fd;
    }
  }
  else {
    uVar3 = anchorNameHash(name);
    s = prvTidytmbstrtolower(s);
  }
  pAVar5 = (Anchor *)((doc->attribs).anchor_hash + uVar3);
  do {
    pAVar5 = pAVar5->next;
    if (pAVar5 == (Anchor *)0x0) {
      (*doc->allocator->vtbl->free)(doc->allocator,s);
      return (Node *)0x0;
    }
    iVar2 = prvTidytmbstrcmp(pAVar5->name,s);
  } while (iVar2 != 0);
  (*doc->allocator->vtbl->free)(doc->allocator,s);
  return pAVar5->node;
}

Assistant:

static Node* GetNodeByAnchor( TidyDocImpl* doc, ctmbstr name )
{
    TidyAttribImpl* attribs = &doc->attribs;
    Anchor *found;
    uint h;
    tmbstr lname = TY_(tmbstrdup)(doc->allocator, name);
    if (TY_(HTMLVersion)(doc) == HT50) {
        h = anchorNameHash5(name);
    }
    else
    {
        h = anchorNameHash(name);
        lname = TY_(tmbstrtolower)(lname);
    }

    for ( found = attribs->anchor_hash[h]; found != NULL; found = found->next )
    {
        if ( TY_(tmbstrcmp)(found->name, lname) == 0 )
            break;
    }
    
    TidyDocFree(doc, lname);
    if ( found )
        return found->node;
    return NULL;
}